

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

string * __thiscall
pstore::database::build_sync_name_abi_cxx11_
          (string *__return_storage_ptr__,database *this,header *header)

{
  uint128 val;
  container_type *bytes;
  unsigned_long *puVar1;
  string *__return_storage_ptr___00;
  unsigned_long local_40;
  base32 *local_38 [3];
  undefined1 local_19;
  database *local_18;
  header *header_local;
  string *name;
  
  local_19 = 0;
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_18 = this;
  header_local = (header *)__return_storage_ptr__;
  bytes = uuid::array((uuid *)&(this->storage_).file_);
  uint128::uint128((uint128 *)local_38,bytes);
  val.v_._8_8_ = __return_storage_ptr___00;
  val.v_._0_8_ = __return_storage_ptr__;
  base32::convert<pstore::uint128>(__return_storage_ptr___00,local_38[0],val);
  local_40 = std::__cxx11::string::length();
  puVar1 = std::min<unsigned_long>(&sync_name_length,&local_40);
  std::__cxx11::string::erase((ulong)__return_storage_ptr___00,*puVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string database::build_sync_name (header const & header) {
        auto name = base32::convert (uint128{header.a.id.array ()});
        name.erase (std::min (sync_name_length, name.length ()));
        return name;
    }